

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

Error __thiscall llvm::ErrorList::join(ErrorList *this,Error *E1,Error *E2)

{
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *puVar1;
  const_iterator __position;
  bool bVar2;
  ErrorInfoBase *pEVar3;
  long lVar4;
  ErrorList *this_00;
  ulong uVar5;
  pointer *__ptr;
  __uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> _Var6;
  pointer __p;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *__args;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> Tmp;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> Tmp_2;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> local_38;
  
  uVar5 = (ulong)E1->Payload & 0xfffffffffffffffe;
  E1->Payload = (ErrorInfoBase *)(uVar5 != 0 | uVar5);
  pEVar3 = E2->Payload;
  if (uVar5 == 0) {
LAB_001453b2:
    (this->super_ErrorInfo<llvm::ErrorList,_llvm::ErrorInfoBase>).super_ErrorInfoBase.
    _vptr_ErrorInfoBase = (_func_int **)((ulong)pEVar3 | 1);
    E2->Payload = (ErrorInfoBase *)0x0;
    return (Error)(ErrorInfoBase *)this;
  }
  uVar5 = (ulong)pEVar3 & 0xfffffffffffffffe;
  E2->Payload = (ErrorInfoBase *)(uVar5 != 0 | uVar5);
  if (uVar5 == 0) goto LAB_001453fd;
  bVar2 = Error::isA<llvm::ErrorList>(E1);
  if (!bVar2) {
    bVar2 = Error::isA<llvm::ErrorList>(E2);
    if (!bVar2) {
      this_00 = (ErrorList *)operator_new(0x20);
      local_38._M_head_impl = (ErrorInfoBase *)((ulong)E1->Payload & 0xfffffffffffffffe);
      E1->Payload = (ErrorInfoBase *)0x0;
      Tmp_2._M_t.
      super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
      super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
      super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>,_true,_true>
            )((ulong)E2->Payload & 0xfffffffffffffffe);
      E2->Payload = (ErrorInfoBase *)0x0;
      ErrorList(this_00,(unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>
                         *)&local_38,&Tmp_2);
      Tmp._M_t.super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>
      ._M_t.super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
      .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>,_true,_true>
            )(__uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>)0x0;
      (this->super_ErrorInfo<llvm::ErrorList,_llvm::ErrorInfoBase>).super_ErrorInfoBase.
      _vptr_ErrorInfoBase = (_func_int **)((ulong)this_00 | 1);
      std::unique_ptr<llvm::ErrorList,_std::default_delete<llvm::ErrorList>_>::~unique_ptr
                ((unique_ptr<llvm::ErrorList,_std::default_delete<llvm::ErrorList>_> *)&Tmp);
      if ((__uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>)
          Tmp_2._M_t.
          super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t
          .super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
          super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>)0x0) {
        (**(code **)(*(long *)Tmp_2._M_t.
                              super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
                              .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl + 8)
        )();
      }
      Tmp_2._M_t.
      super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
      super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
      super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>,_true,_true>
            )(__uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>)0x0;
      if (local_38._M_head_impl == (ErrorInfoBase *)0x0) {
        return (Error)(ErrorInfoBase *)this;
      }
      (*(local_38._M_head_impl)->_vptr_ErrorInfoBase[1])();
      return (Error)(ErrorInfoBase *)this;
    }
    uVar5 = (ulong)E2->Payload & 0xfffffffffffffffe;
    __position._M_current =
         *(unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> **)(uVar5 + 8)
    ;
    Tmp._M_t.super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>.
    _M_t.super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
    super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>,_true,_true>
         )((ulong)E1->Payload & 0xfffffffffffffffe);
    E1->Payload = (ErrorInfoBase *)0x0;
    std::
    vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
    ::_M_insert_rval((vector<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>,_std::allocator<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>_>
                      *)(uVar5 + 8),__position,&Tmp);
    if ((__uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>)
        Tmp._M_t.
        super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
        super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
        super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>)0x0) {
      (**(code **)(*(long *)Tmp._M_t.
                            super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
                            .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl + 8))
                ();
    }
    pEVar3 = E2->Payload;
    goto LAB_001453b2;
  }
  uVar5 = (ulong)E1->Payload & 0xfffffffffffffffe;
  bVar2 = Error::isA<llvm::ErrorList>(E2);
  if (bVar2) {
    pEVar3 = E2->Payload;
    E2->Payload = (ErrorInfoBase *)0x0;
    _Var6._M_t.
    super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
    super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
         (tuple<llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>)
         ((ulong)pEVar3 & 0xfffffffffffffffe);
    puVar1 = *(unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> **)
              ((long)_Var6._M_t.
                     super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
                     .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl + 0x10);
    for (__args = *(unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> **)
                   ((long)_Var6._M_t.
                          super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
                          .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl + 8);
        __args != puVar1; __args = __args + 1) {
      std::
      vector<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>,std::allocator<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>>
      ::emplace_back<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>
                ((vector<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>,std::allocator<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>>
                  *)(uVar5 + 8),__args);
    }
    if ((_Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>)
        _Var6._M_t.
        super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
        super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl == (ErrorInfoBase *)0x0)
    goto LAB_001453fd;
    lVar4 = *(long *)_Var6._M_t.
                     super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
                     .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl;
  }
  else {
    Tmp._M_t.super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>.
    _M_t.super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
    super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>,_true,_true>
         )((ulong)E2->Payload & 0xfffffffffffffffe);
    E2->Payload = (ErrorInfoBase *)0x0;
    std::
    vector<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>,std::allocator<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>>
    ::emplace_back<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>
              ((vector<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>,std::allocator<std::unique_ptr<llvm::ErrorInfoBase,std::default_delete<llvm::ErrorInfoBase>>>>
                *)(uVar5 + 8),&Tmp);
    if ((__uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>)
        Tmp._M_t.
        super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
        super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
        super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>)0x0)
    goto LAB_001453fd;
    lVar4 = *(long *)Tmp._M_t.
                     super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
                     .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl;
    _Var6._M_t.
    super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
    super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
         (tuple<llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>)
         (tuple<llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>)
         Tmp._M_t.
         super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
         super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
         super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl;
  }
  (**(code **)(lVar4 + 8))
            (_Var6._M_t.
             super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
             .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl);
LAB_001453fd:
  (this->super_ErrorInfo<llvm::ErrorList,_llvm::ErrorInfoBase>).super_ErrorInfoBase.
  _vptr_ErrorInfoBase = (_func_int **)((ulong)E1->Payload | 1);
  E1->Payload = (ErrorInfoBase *)0x0;
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

static Error join(Error E1, Error E2) {
    if (!E1)
      return E2;
    if (!E2)
      return E1;
    if (E1.isA<ErrorList>()) {
      auto &E1List = static_cast<ErrorList &>(*E1.getPtr());
      if (E2.isA<ErrorList>()) {
        auto E2Payload = E2.takePayload();
        auto &E2List = static_cast<ErrorList &>(*E2Payload);
        for (auto &Payload : E2List.Payloads)
          E1List.Payloads.push_back(std::move(Payload));
      } else
        E1List.Payloads.push_back(E2.takePayload());

      return E1;
    }
    if (E2.isA<ErrorList>()) {
      auto &E2List = static_cast<ErrorList &>(*E2.getPtr());
      E2List.Payloads.insert(E2List.Payloads.begin(), E1.takePayload());
      return E2;
    }
    return Error(std::unique_ptr<ErrorList>(
        new ErrorList(E1.takePayload(), E2.takePayload())));
  }